

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O3

void __thiscall
nuraft::asio_rpc_client::ctx_read
          (asio_rpc_client *this,ptr<req_msg> *req,ptr<resp_msg> *rsp,rpc_handler *when_done,
          ptr<buffer> *ctx_buf,uint32_t flags,error_code err,size_t bytes_transferred)

{
  element_type *peVar1;
  asio_rpc_client *this_00;
  bool bVar2;
  uint16_t uVar3;
  size_t sVar4;
  void *pvVar5;
  int64_t iVar6;
  undefined8 uVar7;
  int iVar8;
  int iVar9;
  size_t resp_meta_len;
  buffer_serializer bs;
  undefined1 local_98 [32];
  asio_rpc_client *local_78;
  size_t local_70;
  element_type *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  element_type *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  buffer_serializer local_48;
  
  if ((flags & 3) == 0) {
    buffer::pos((ctx_buf->super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,0);
    peVar1 = (rsp->super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_58 = (ctx_buf->super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_50._M_pi =
         (ctx_buf->super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
    ;
    if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_50._M_pi)->_M_use_count = (local_50._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_50._M_pi)->_M_use_count = (local_50._M_pi)->_M_use_count + 1;
      }
    }
    (peVar1->ctx_).super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_58;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(peVar1->ctx_).super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,&local_50);
    if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50._M_pi);
    }
    asio::
    basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
    ::cancel(&this->operation_timer_);
    set_busy_flag(this,false);
    local_98._0_8_ = (element_type *)0x0;
    local_98._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if ((when_done->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_001d3061;
    (*when_done->_M_invoker)
              ((_Any_data *)when_done,rsp,(shared_ptr<nuraft::rpc_exception> *)local_98);
    goto LAB_001d303e;
  }
  local_78 = this;
  buffer_serializer::buffer_serializer(&local_48,ctx_buf,LITTLE);
  sVar4 = buffer::size((ctx_buf->super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr);
  iVar9 = (int)sVar4;
  if ((flags & 1) != 0) {
    local_70 = 0;
    pvVar5 = buffer_serializer::get_bytes(&local_48,&local_70);
    sVar4 = local_70;
    if ((local_78->impl_->my_opt_).read_resp_meta_.super__Function_base._M_manager ==
        (_Manager_type)0x0) {
LAB_001d2f3f:
      iVar8 = (int)sVar4;
    }
    else {
      if ((local_70 == 0) && ((local_78->impl_->my_opt_).invoke_resp_cb_on_empty_meta_ != true)) {
        sVar4 = 0;
        goto LAB_001d2f3f;
      }
      local_98._0_8_ = (element_type *)(local_98 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_98,pvVar5,local_70 + (long)pvVar5);
      bVar2 = handle_custom_resp_meta(local_78,req,rsp,when_done,(string *)local_98);
      if ((element_type *)local_98._0_8_ != (element_type *)(local_98 + 0x10)) {
        operator_delete((void *)local_98._0_8_);
      }
      if (!bVar2) {
        return;
      }
      iVar8 = (int)local_70;
    }
    iVar9 = (iVar9 - iVar8) + -4;
  }
  if ((flags & 2) != 0) {
    buffer_serializer::get_u16(&local_48);
    uVar3 = buffer_serializer::get_u16(&local_48);
    peVar1 = (rsp->super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    iVar6 = buffer_serializer::get_i64(&local_48);
    peVar1->next_batch_size_hint_in_bytes_ = iVar6;
    iVar9 = (iVar9 - (uint)uVar3) + -4;
  }
  if (iVar9 != 0) {
    buffer::alloc((buffer *)local_98,(long)iVar9);
    buffer_serializer::get_buffer(&local_48,(ptr<buffer> *)local_98);
    peVar1 = (rsp->super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_68 = (element_type *)local_98._0_8_;
    local_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_98._8_8_ + 8) = *(_Atomic_word *)(local_98._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_98._8_8_ + 8) = *(_Atomic_word *)(local_98._8_8_ + 8) + 1;
      }
    }
    (peVar1->ctx_).super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_98._0_8_;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(peVar1->ctx_).super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,&local_60);
    if (local_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
    }
  }
  this_00 = local_78;
  asio::
  basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
  ::cancel(&local_78->operation_timer_);
  set_busy_flag(this_00,false);
  local_98._0_8_ = (element_type *)0x0;
  local_98._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((when_done->super__Function_base)._M_manager == (_Manager_type)0x0) {
    std::__throw_bad_function_call();
LAB_001d3061:
    uVar7 = std::__throw_bad_function_call();
    if ((ptr<resp_msg> *)local_98._0_8_ != rsp) {
      operator_delete((void *)local_98._0_8_);
    }
    _Unwind_Resume(uVar7);
  }
  (*when_done->_M_invoker)((_Any_data *)when_done,rsp,(shared_ptr<nuraft::rpc_exception> *)local_98)
  ;
LAB_001d303e:
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
  }
  return;
}

Assistant:

void ctx_read(ptr<req_msg>& req,
                  ptr<resp_msg>& rsp,
                  rpc_handler& when_done,
                  ptr<buffer>& ctx_buf,
                  uint32_t flags,
                  std::error_code err,
                  size_t bytes_transferred)
    {
        if ( !(flags & INCLUDE_META) &&
             !(flags & INCLUDE_HINT) ) {
            // Neither meta nor hint exists,
            // just use the buffer as it is for ctx.
            ctx_buf->pos(0);
            rsp->set_ctx(ctx_buf);

            operation_timer_.cancel();
            set_busy_flag(false);
            ptr<rpc_exception> except;
            when_done(rsp, except);
            return;
        }

        // Otherwise: buffer contains composite data.
        buffer_serializer bs(ctx_buf);
        int remaining_len = ctx_buf->size();

        // 1) Custom meta.
        if (flags & INCLUDE_META) {
            size_t resp_meta_len = 0;
            void* resp_meta_raw = bs.get_bytes(resp_meta_len);

            // If callback is given, verify meta
            // (if meta is empty, invoke callback according to the flag).
            if ( impl_->get_options().read_resp_meta_ &&
                 ( resp_meta_len ||
                   impl_->get_options().invoke_resp_cb_on_empty_meta_ ) ) {

                bool meta_ok = handle_custom_resp_meta
                               ( req, rsp, when_done,
                                 std::string( (const char*)resp_meta_raw,
                                              resp_meta_len) );
                if (!meta_ok) return;
            }
            remaining_len -= sizeof(int32) + resp_meta_len;
        }

        // 2) Hint.
        if (flags & INCLUDE_HINT) {
            size_t hint_len = 0;
            uint16_t hint_version = bs.get_u16();
            (void)hint_version;
            hint_len = bs.get_u16();
            rsp->set_next_batch_size_hint_in_bytes(bs.get_i64());
            remaining_len -= sizeof(uint16_t) * 2 + hint_len;
        }

        // 3) Context.
        assert(remaining_len >= 0);
        if (remaining_len) {
            // It has context, read it.
            ptr<buffer> actual_ctx = buffer::alloc(remaining_len);
            bs.get_buffer(actual_ctx);
            rsp->set_ctx(actual_ctx);
        }

        operation_timer_.cancel();
        set_busy_flag(false);
        ptr<rpc_exception> except;
        when_done(rsp, except);
    }